

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void __thiscall amrex::FArrayBox::FArrayBox(FArrayBox *this,Box *b,int ncomp,Arena *ar)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  BaseFab<double> *in_RSI;
  Arena *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  BaseFab<double>::BaseFab
            (in_RSI,(Box *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(int)((ulong)in_RCX >> 0x20),
             in_RDI);
  in_RDI->_vptr_Arena = (_func_int **)&PTR__FArrayBox_01aa2a00;
  *(undefined4 *)&in_RDI[2].arena_info.device_use_hostalloc = 0;
  initVal((FArrayBox *)ar);
  return;
}

Assistant:

FArrayBox::FArrayBox (const Box& b, int ncomp, Arena* ar)
    : BaseFab<Real>(b,ncomp,ar)
{
    initVal();
}